

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatBase
          (ParsedFormatBase *this,string_view format,bool allow_ignored,
          initializer_list<absl::lts_20250127::FormatConversionCharSet> convs)

{
  initializer_list<absl::lts_20250127::FormatConversionCharSet> convs_00;
  string_view src;
  bool bVar1;
  size_type sVar2;
  byte local_c2;
  char *local_b0;
  ParsedFormatConsumer local_78;
  size_t local_68;
  char *pcStack_60;
  bool local_49;
  size_type local_48;
  char *local_40;
  byte local_31;
  ParsedFormatBase *pPStack_30;
  bool allow_ignored_local;
  ParsedFormatBase *this_local;
  initializer_list<absl::lts_20250127::FormatConversionCharSet> convs_local;
  string_view format_local;
  
  convs_local._M_array = (iterator)convs._M_len;
  this_local = (ParsedFormatBase *)convs._M_array;
  convs_local._M_len = format._M_len;
  local_31 = allow_ignored;
  pPStack_30 = this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&convs_local._M_len);
  local_49 = false;
  if (bVar1) {
    local_b0 = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&convs_local._M_len);
    local_b0 = (char *)operator_new__(sVar2);
    local_48 = sVar2;
    local_40 = local_b0;
  }
  local_49 = !bVar1;
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data_,local_b0);
  std::
  vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  ::vector(&this->items_);
  local_68 = convs_local._M_len;
  pcStack_60 = format._M_str;
  ParsedFormatConsumer::ParsedFormatConsumer(&local_78,this);
  src._M_str = pcStack_60;
  src._M_len = local_68;
  bVar1 = ParseFormatString<absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer>
                    (src,local_78);
  local_c2 = 1;
  if (bVar1) {
    convs_00._M_len = (size_type)convs_local._M_array;
    convs_00._M_array = (iterator)this_local;
    bVar1 = MatchesConversions(this,(bool)(local_31 & 1),convs_00);
    local_c2 = bVar1 ^ 0xff;
  }
  this->has_error_ = (bool)(local_c2 & 1);
  return;
}

Assistant:

ParsedFormatBase::ParsedFormatBase(
    string_view format, bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs)
    : data_(format.empty() ? nullptr : new char[format.size()]) {
  has_error_ = !ParseFormatString(format, ParsedFormatConsumer(this)) ||
               !MatchesConversions(allow_ignored, convs);
}